

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O0

void pinger_write_ping(pinger_t *pinger)

{
  int iVar1;
  uv_buf_t uVar2;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  uint local_70;
  int local_6c;
  int nbufs;
  int i;
  uv_buf_t bufs [5];
  uv_write_t *req;
  pinger_t *pinger_local;
  
  if (pinger->vectored_writes == 0) {
    local_70 = 1;
    uVar2 = uv_buf_init(PING,5);
    local_80 = uVar2.base;
    _nbufs = local_80;
    local_78 = (char *)uVar2.len;
    bufs[0].base = local_78;
  }
  else {
    local_70 = 5;
    for (local_6c = 0; local_6c < 5; local_6c = local_6c + 1) {
      uVar2 = uv_buf_init(PING + local_6c,1);
      local_90 = uVar2.base;
      *(char **)(&nbufs + (long)local_6c * 4) = local_90;
      local_88 = (char *)uVar2.len;
      bufs[local_6c].base = local_88;
    }
  }
  bufs[4].len = (size_t)malloc(0xc0);
  iVar1 = uv_write((uv_write_t *)bufs[4].len,(uv_stream_t *)&(pinger->stream).tcp,(uv_buf_t *)&nbufs
                   ,local_70,pinger_after_write);
  if (iVar1 == 0) {
    puts("PING");
    return;
  }
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
          ,0x66,"uv_write failed");
  fflush(_stderr);
  abort();
}

Assistant:

static void pinger_write_ping(pinger_t* pinger) {
  uv_write_t *req;
  uv_buf_t bufs[sizeof PING - 1];
  int i, nbufs;

  if (!pinger->vectored_writes) {
    /* Write a single buffer. */
    nbufs = 1;
    bufs[0] = uv_buf_init(PING, sizeof PING - 1);
  } else {
    /* Write multiple buffers, each with one byte in them. */
    nbufs = sizeof PING - 1;
    for (i = 0; i < nbufs; i++) {
      bufs[i] = uv_buf_init(&PING[i], 1);
    }
  }

  req = malloc(sizeof(*req));
  if (uv_write(req,
               (uv_stream_t*) &pinger->stream.tcp,
               bufs,
               nbufs,
               pinger_after_write)) {
    FATAL("uv_write failed");
  }

  puts("PING");
}